

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O0

bool __thiscall cmQtAutoGeneratorRcc::GenerateRcc(cmQtAutoGeneratorRcc *this)

{
  bool bVar1;
  pointer pRVar2;
  ulong uVar3;
  Logger *pLVar4;
  SetupT *pSVar5;
  FileSystem *this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  const_iterator local_b0;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string emsg;
  cmQtAutoGeneratorRcc *this_local;
  
  if ((this->Generate_ & 1U) == 0) {
    this_local._7_1_ = true;
  }
  else {
    emsg.field_2._8_8_ = this;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Process_);
    if (bVar1) {
      pRVar2 = std::
               unique_ptr<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
               ::operator->(&this->Process_);
      bVar1 = cmQtAutoGenerator::ReadOnlyProcessT::IsFinished(pRVar2);
      if (bVar1) {
        bVar1 = cmQtAutoGenerator::ProcessResultT::error(&this->ProcessResult_);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_38,"The rcc process failed to compile\n  ",&local_39);
          std::allocator<char>::~allocator(&local_39);
          cmQtAutoGen::Quoted(&local_70,&this->QrcFile_);
          std::__cxx11::string::operator+=((string *)local_38,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::operator+=((string *)local_38,"\ninto\n  ");
          cmQtAutoGen::Quoted((string *)
                              &cmd.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              &this->RccFileOutput_);
          std::__cxx11::string::operator+=
                    ((string *)local_38,
                     (string *)
                     &cmd.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &cmd.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = cmQtAutoGenerator::ProcessResultT::error(&this->ProcessResult_);
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)local_38,"\n");
            std::__cxx11::string::operator+=
                      ((string *)local_38,(string *)&(this->ProcessResult_).ErrorMessage);
          }
          pLVar4 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
          pRVar2 = std::
                   unique_ptr<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
                   ::operator->(&this->Process_);
          pSVar5 = cmQtAutoGenerator::ReadOnlyProcessT::Setup(pRVar2);
          cmQtAutoGenerator::Logger::ErrorCommand
                    (pLVar4,RCC,(string *)local_38,&pSVar5->Command,&(this->ProcessResult_).StdOut);
          std::__cxx11::string::~string((string *)local_38);
          this_00 = cmQtAutoGenerator::FileSys(&this->super_cmQtAutoGenerator);
          cmQtAutoGenerator::FileSystem::FileRemove(this_00,&this->RccFileOutput_);
          this->Error_ = true;
        }
        else {
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            pLVar4 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
            cmQtAutoGenerator::Logger::Info(pLVar4,RCC,&(this->ProcessResult_).StdOut);
          }
          this->BuildFileChanged_ = true;
        }
        std::
        unique_ptr<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
        ::reset(&this->Process_,(pointer)0x0);
        cmQtAutoGenerator::ProcessResultT::reset(&this->ProcessResult_);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&this->RccExecutable_);
      local_b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_b0,&local_b8);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&this->Options_);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->Options_);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a8,
                 local_b0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )__first._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a8,
                 (char (*) [3])"-o");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&this->RccFileOutput_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&this->QrcFile_);
      bVar1 = StartProcess(this,&this->AutogenBuildDir_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a8,true);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGeneratorRcc::GenerateRcc()
{
  if (!Generate_) {
    // Nothing to do
    return true;
  }

  if (Process_) {
    // Process is running already
    if (Process_->IsFinished()) {
      // Process is finished
      if (!ProcessResult_.error()) {
        // Rcc process success
        // Print rcc output
        if (!ProcessResult_.StdOut.empty()) {
          Log().Info(GenT::RCC, ProcessResult_.StdOut);
        }
        BuildFileChanged_ = true;
      } else {
        // Rcc process failed
        {
          std::string emsg = "The rcc process failed to compile\n  ";
          emsg += Quoted(QrcFile_);
          emsg += "\ninto\n  ";
          emsg += Quoted(RccFileOutput_);
          if (ProcessResult_.error()) {
            emsg += "\n";
            emsg += ProcessResult_.ErrorMessage;
          }
          Log().ErrorCommand(GenT::RCC, emsg, Process_->Setup().Command,
                             ProcessResult_.StdOut);
        }
        FileSys().FileRemove(RccFileOutput_);
        Error_ = true;
      }
      // Clean up
      Process_.reset();
      ProcessResult_.reset();
    } else {
      // Process is not finished, yet.
      return false;
    }
  } else {
    // Start a rcc process
    std::vector<std::string> cmd;
    cmd.push_back(RccExecutable_);
    cmd.insert(cmd.end(), Options_.begin(), Options_.end());
    cmd.emplace_back("-o");
    cmd.push_back(RccFileOutput_);
    cmd.push_back(QrcFile_);
    // We're done here if the process fails to start
    return !StartProcess(AutogenBuildDir_, cmd, true);
  }

  return true;
}